

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O1

uint32_t __thiscall HvFile::createpath(HvFile *this,HKEY root,pathmap_t *pmap,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint32_t uVar3;
  iterator iVar4;
  long lVar5;
  undefined8 *puVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  string local_50;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&pmap->_M_t,path);
  if ((_Rb_tree_header *)iVar4._M_node == &(pmap->_M_t)._M_impl.super__Rb_tree_header) {
    lVar5 = std::__cxx11::string::find_last_of((char *)path,0x12c8f5,0xffffffffffffffff);
    if (lVar5 == -1) {
      uVar3 = 0;
      local_78.first._M_dataplus._M_p = (pointer)&local_78.first.field_2;
      pcVar2 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + path->_M_string_length);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
      uVar3 = createpath(this,root,pmap,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_78,(ulong)path);
    }
    uVar3 = allocpath(this,root,uVar3,&local_78.first);
    paVar1 = &local_78.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (path->_M_dataplus)._M_p;
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + path->_M_string_length);
    local_78.second = uVar3;
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)pmap,&local_78);
    iVar4._M_node = (_Base_ptr)pVar7.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = "insert failed unexpectedly";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    }
  }
  return iVar4._M_node[2]._M_color;
}

Assistant:

uint32_t createpath(HKEY root, pathmap_t& pmap, const std::string& path)
    {
        auto p= pmap.find(path);
        if (p!=pmap.end())
            return p->second;

        size_t slash= path.find_last_of("\\");
        uint32_t parentid= slash==path.npos ? 0 : createpath(root, pmap, path.substr(0,slash));

        uint32_t id= allocpath(root, parentid, slash==path.npos ? path : path.substr(slash+1));

        auto ins= pmap.insert(pathmap_t::value_type(path, id));
        if (!ins.second)
            throw "insert failed unexpectedly";
        return ins.first->second;
    }